

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

void __thiscall Catch::ConsoleReporter::printTotalsDivider(ConsoleReporter *this,Totals *totals)

{
  uint64_t uVar1;
  uint64_t uVar2;
  ColourImpl *pCVar3;
  ulong uVar4;
  ConsoleReporter *pCVar5;
  ulong uVar6;
  ulong uVar7;
  ostream *poVar8;
  ulong *puVar9;
  ulong *puVar10;
  size_t skippedRatio;
  size_t passedRatio;
  size_t failedButOkRatio;
  size_t failedRatio;
  long *local_a0;
  long local_98;
  long local_90 [2];
  ulong local_80 [4];
  ColourImpl *local_60;
  ConsoleReporter *local_58;
  long *local_50;
  long local_48;
  long local_40 [2];
  
  uVar2 = (totals->testCases).passed;
  uVar4 = (totals->testCases).skipped + (totals->testCases).failed +
          (totals->testCases).failedButOk + uVar2;
  if (uVar4 == 0) {
    poVar8 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0x16);
    local_a0 = local_90;
    std::__cxx11::string::_M_construct((ulong)&local_a0,'O');
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_a0,local_98);
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
  }
  else {
    uVar1 = (totals->testCases).failed;
    uVar7 = uVar1 * 0x50;
    uVar6 = uVar7 / uVar4;
    local_80[3] = uVar6;
    if (uVar7 < uVar4) {
      local_80[3] = 1;
    }
    if (uVar1 == 0) {
      local_80[3] = uVar6;
    }
    uVar1 = (totals->testCases).failedButOk;
    uVar7 = uVar1 * 0x50;
    uVar6 = uVar7 / uVar4;
    local_80[2] = uVar6;
    if (uVar7 < uVar4) {
      local_80[2] = 1;
    }
    if (uVar1 == 0) {
      local_80[2] = uVar6;
    }
    uVar7 = (uVar2 * 0x50) / uVar4;
    local_80[1] = uVar7;
    if (uVar2 * 0x50 < uVar4) {
      local_80[1] = 1;
    }
    if (uVar2 == 0) {
      local_80[1] = uVar7;
    }
    uVar2 = (totals->testCases).skipped;
    uVar7 = uVar2 * 0x50;
    puVar9 = (ulong *)(uVar7 % uVar4);
    local_80[0] = 1;
    if (uVar4 <= uVar7) {
      local_80[0] = uVar7 / uVar4;
    }
    if (uVar2 == 0) {
      local_80[0] = uVar7 / uVar4;
    }
    if (local_80[1] + local_80[0] + local_80[2] + local_80[3] < 0x4f) {
      puVar9 = local_80 + 1;
      do {
        if ((((local_80[3] <= local_80[2]) || (local_80[3] <= local_80[1])) ||
            (puVar10 = local_80 + 3, local_80[3] <= local_80[0])) &&
           (((local_80[2] <= local_80[1] || (puVar10 = local_80 + 2, local_80[2] <= local_80[0])) &&
            (puVar10 = puVar9, local_80[1] <= local_80[0])))) {
          puVar10 = local_80;
        }
        *puVar10 = *puVar10 + 1;
      } while (local_80[1] + local_80[0] + local_80[2] + local_80[3] < 0x4f);
    }
    if (0x4f < local_80[2] + local_80[3] + local_80[1]) {
      puVar9 = local_80 + 1;
      do {
        puVar10 = local_80 + 3;
        if ((((local_80[3] <= local_80[1] || local_80[3] <= local_80[2]) ||
              local_80[3] <= local_80[0]) &&
            (puVar10 = local_80 + 2, local_80[2] <= local_80[1] || local_80[2] <= local_80[0])) &&
           (puVar10 = puVar9, local_80[1] <= local_80[0])) {
          puVar10 = local_80;
        }
        *puVar10 = *puVar10 - 1;
      } while (0x4f < local_80[2] + local_80[3] + local_80[1]);
    }
    uVar6 = local_80[3];
    uVar7 = local_80[2];
    uVar4 = local_80[1];
    poVar8 = (this->super_StreamingReporterBase).super_ReporterBase.m_stream;
    local_60 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    (*local_60->_vptr_ColourImpl[2])(local_60,0x12,puVar9);
    local_a0 = local_90;
    std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar6);
    poVar8 = std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_a0,local_98);
    pCVar3 = (this->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    local_58 = this;
    (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0x16);
    local_50 = local_40;
    std::__cxx11::string::_M_construct((ulong)&local_50,(char)uVar7);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_50,local_48);
    if (local_50 != local_40) {
      operator_delete(local_50,local_40[0] + 1);
    }
    (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
    pCVar5 = local_58;
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    (*local_60->_vptr_ColourImpl[2])(local_60,0);
    poVar8 = (pCVar5->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar3 = (pCVar5->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    if ((((totals->testCases).failed == 0) && ((totals->testCases).failedButOk == 0)) &&
       ((totals->testCases).skipped == 0)) {
      (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0x13);
      local_a0 = local_90;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_a0,local_98);
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
    }
    else {
      (*pCVar3->_vptr_ColourImpl[2])(pCVar3,3);
      local_a0 = local_90;
      std::__cxx11::string::_M_construct((ulong)&local_a0,(char)uVar4);
      std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_a0,local_98);
      if (local_a0 != local_90) {
        operator_delete(local_a0,local_90[0] + 1);
      }
      (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
    }
    this = local_58;
    poVar8 = (local_58->super_StreamingReporterBase).super_ReporterBase.m_stream;
    pCVar3 = (local_58->super_StreamingReporterBase).super_ReporterBase.m_colour.m_ptr;
    (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0x17);
    local_a0 = local_90;
    std::__cxx11::string::_M_construct((ulong)&local_a0,(char)local_80[0]);
    std::__ostream_insert<char,std::char_traits<char>>(poVar8,(char *)local_a0,local_98);
    if (local_a0 != local_90) {
      operator_delete(local_a0,local_90[0] + 1);
    }
    (*pCVar3->_vptr_ColourImpl[2])(pCVar3,0);
  }
  local_a0 = (long *)CONCAT71(local_a0._1_7_,10);
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->super_StreamingReporterBase).super_ReporterBase.m_stream,(char *)&local_a0,1);
  return;
}

Assistant:

void ConsoleReporter::printTotalsDivider(Totals const& totals) {
    if (totals.testCases.total() > 0) {
        std::size_t failedRatio = makeRatio(totals.testCases.failed, totals.testCases.total());
        std::size_t failedButOkRatio = makeRatio(totals.testCases.failedButOk, totals.testCases.total());
        std::size_t passedRatio = makeRatio(totals.testCases.passed, totals.testCases.total());
        std::size_t skippedRatio = makeRatio(totals.testCases.skipped, totals.testCases.total());
        while (failedRatio + failedButOkRatio + passedRatio + skippedRatio < CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)++;
        while (failedRatio + failedButOkRatio + passedRatio > CATCH_CONFIG_CONSOLE_WIDTH - 1)
            findMax(failedRatio, failedButOkRatio, passedRatio, skippedRatio)--;

        m_stream << m_colour->guardColour( Colour::Error )
                 << std::string( failedRatio, '=' )
                 << m_colour->guardColour( Colour::ResultExpectedFailure )
                 << std::string( failedButOkRatio, '=' );
        if ( totals.testCases.allPassed() ) {
            m_stream << m_colour->guardColour( Colour::ResultSuccess )
                     << std::string( passedRatio, '=' );
        } else {
            m_stream << m_colour->guardColour( Colour::Success )
                     << std::string( passedRatio, '=' );
        }
        m_stream << m_colour->guardColour( Colour::Skip )
                 << std::string( skippedRatio, '=' );
    } else {
        m_stream << m_colour->guardColour( Colour::Warning )
                 << std::string( CATCH_CONFIG_CONSOLE_WIDTH - 1, '=' );
    }
    m_stream << '\n';
}